

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::CreateObject
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phObject,int op)

{
  undefined8 *puVar1;
  SessionObjectStore *this_00;
  HandleManager *this_01;
  void *pvVar2;
  undefined8 uVar3;
  CK_BBOOL CVar4;
  CK_BBOOL CVar5;
  P11Object *this_02;
  CK_OBJECT_CLASS CVar6;
  char cVar7;
  int iVar8;
  Session *this_03;
  CK_RV CVar9;
  CK_STATE sessionState;
  long lVar10;
  SessionObject *object;
  CK_SLOT_ID CVar11;
  CK_OBJECT_HANDLE CVar12;
  CK_ATTRIBUTE *pCVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  CK_OBJECT_CLASS local_860;
  Token *local_858;
  Slot *local_850;
  CK_SESSION_HANDLE local_848;
  CK_OBJECT_HANDLE *local_840;
  P11Object *p11object;
  CK_CERTIFICATE_TYPE certType;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  OSAttribute local_818;
  OSAttribute local_778;
  OSAttribute local_6d8;
  CK_ATTRIBUTE saveAttribs [32];
  CK_ATTRIBUTE attribs [32];
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (phObject == (CK_OBJECT_HANDLE_PTR)0x0 || pTemplate == (CK_ATTRIBUTE_PTR)0x0) {
    return 7;
  }
  local_848 = hSession;
  local_840 = phObject;
  this_03 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_03 == (Session *)0x0) {
    return 0xb3;
  }
  local_850 = Session::getSlot(this_03);
  if (local_850 == (Slot *)0x0) {
    return 5;
  }
  local_858 = Session::getToken(this_03);
  if (local_858 == (Token *)0x0) {
    return 5;
  }
  objClass = 0;
  keyType = 0;
  certType = 0;
  isOnToken = '\0';
  isPrivate = '\x01';
  CVar9 = extractObjectInformation
                    (pTemplate,ulCount,&objClass,&keyType,&certType,&isOnToken,&isPrivate,false);
  if (CVar9 != 0) {
    softHSMLog(3,"CreateObject",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x2e96,"Mandatory attribute not present in template");
    return CVar9;
  }
  sessionState = Session::getState(this_03);
  CVar5 = isOnToken;
  CVar4 = isPrivate;
  CVar9 = haveWrite(sessionState,isOnToken,isPrivate);
  CVar6 = objClass;
  if (CVar9 != 0) {
    if (CVar9 == 0xb5) {
      softHSMLog(6,"CreateObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x2ea1,"Session is read-only");
      return 0xb5;
    }
    if (CVar9 == 0x101) {
      softHSMLog(6,"CreateObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x2e9f,"User is not authorized");
      return 0x101;
    }
    return CVar9;
  }
  if (0x20 < ulCount) {
    return 0xd1;
  }
  lVar15 = 0;
  lVar10 = 0;
  while (bVar17 = ulCount != 0, ulCount = ulCount - 1, bVar17) {
    bVar17 = pTemplate->type == 0x90;
    pCVar13 = attribs + lVar15;
    if (bVar17) {
      pCVar13 = saveAttribs + lVar10;
    }
    lVar15 = lVar15 + (ulong)!bVar17;
    lVar10 = lVar10 + (ulong)bVar17;
    pCVar13->ulValueLen = pTemplate->ulValueLen;
    pvVar2 = pTemplate->pValue;
    pCVar13->type = pTemplate->type;
    pCVar13->pValue = pvVar2;
    pTemplate = pTemplate + 1;
  }
  lVar14 = 0;
  for (lVar16 = 0; -lVar16 != lVar10; lVar16 = lVar16 + -1) {
    *(undefined8 *)((long)&attribs[lVar15].ulValueLen + lVar14) =
         *(undefined8 *)((long)&saveAttribs[0].ulValueLen + lVar14);
    uVar3 = *(undefined8 *)((long)&saveAttribs[0].pValue + lVar14);
    puVar1 = (undefined8 *)((long)&attribs[lVar15].type + lVar14);
    *puVar1 = *(undefined8 *)((long)&saveAttribs[0].type + lVar14);
    puVar1[1] = uVar3;
    lVar14 = lVar14 + 0x18;
  }
  p11object = (P11Object *)0x0;
  CVar9 = newP11Object(objClass,keyType,certType,&p11object);
  if (CVar9 != 0) {
    return CVar9;
  }
  local_860 = CVar6;
  if (CVar5 == '\0') {
    this_00 = this->sessionObjectStore;
    CVar11 = Slot::getSlotID(local_850);
    object = SessionObjectStore::createObject(this_00,CVar11,local_848,CVar4 != '\0');
  }
  else {
    object = (SessionObject *)Token::createObject(local_858);
  }
  this_02 = p11object;
  if (object == (SessionObject *)0x0) {
    if (p11object == (P11Object *)0x0) {
      return 5;
    }
LAB_0012fb25:
    (*this_02->_vptr_P11Object[1])(this_02);
    return 5;
  }
  iVar8 = (*p11object->_vptr_P11Object[2])(p11object,object);
  if ((char)iVar8 == '\0') goto LAB_0012fb25;
  CVar9 = P11Object::saveTemplate(this_02,local_858,CVar4 != '\0',attribs,lVar15 - lVar16,op);
  (*this_02->_vptr_P11Object[1])(this_02);
  if (CVar9 != 0) {
    return CVar9;
  }
  if (op != 2) goto LAB_0012fc0d;
  if (local_860 != 2) {
    if (1 < local_860 - 3) goto LAB_0012fc0d;
    iVar8 = (*(object->super_OSObject)._vptr_OSObject[0xb])(object);
    if ((char)iVar8 == '\0') {
      return 5;
    }
    OSAttribute::OSAttribute(&local_818,false);
    iVar8 = (*(object->super_OSObject)._vptr_OSObject[8])(object,0x163,&local_818);
    if ((char)iVar8 == '\0') goto LAB_0012fc89;
    OSAttribute::OSAttribute(&local_778,false);
    iVar8 = (*(object->super_OSObject)._vptr_OSObject[8])(object,0x165,&local_778);
    if ((char)iVar8 != '\0') {
      OSAttribute::OSAttribute(&local_6d8,false);
      iVar8 = (*(object->super_OSObject)._vptr_OSObject[8])(object,0x164,&local_6d8);
      if ((char)iVar8 != '\0') {
        iVar8 = (*(object->super_OSObject)._vptr_OSObject[0xc])(object);
        cVar7 = (char)iVar8;
        OSAttribute::~OSAttribute(&local_6d8);
        OSAttribute::~OSAttribute(&local_778);
        goto LAB_0012fb08;
      }
      OSAttribute::~OSAttribute(&local_6d8);
    }
    OSAttribute::~OSAttribute(&local_778);
LAB_0012fc89:
    OSAttribute::~OSAttribute(&local_818);
    return 5;
  }
  iVar8 = (*(object->super_OSObject)._vptr_OSObject[0xb])(object);
  if ((char)iVar8 == '\0') {
    return 5;
  }
  OSAttribute::OSAttribute(&local_818,false);
  iVar8 = (*(object->super_OSObject)._vptr_OSObject[8])(object,0x163,&local_818);
  if ((char)iVar8 == '\0') goto LAB_0012fc89;
  iVar8 = (*(object->super_OSObject)._vptr_OSObject[0xc])(object);
  cVar7 = (char)iVar8;
LAB_0012fb08:
  OSAttribute::~OSAttribute(&local_818);
  if (cVar7 == '\0') {
    return 5;
  }
LAB_0012fc0d:
  this_01 = this->handleManager;
  CVar11 = Slot::getSlotID(local_850);
  if (CVar5 == '\0') {
    CVar12 = HandleManager::addSessionObject(this_01,CVar11,local_848,CVar4 != '\0',object);
  }
  else {
    CVar12 = HandleManager::addTokenObject(this_01,CVar11,CVar4 != '\0',object);
  }
  *local_840 = CVar12;
  return 0;
}

Assistant:

CK_RV SoftHSM::CreateObject(CK_SESSION_HANDLE hSession, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount, CK_OBJECT_HANDLE_PTR phObject, int op)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phObject == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Extract information from the template that is needed to create the object.
	CK_OBJECT_CLASS objClass = CKO_DATA;
	CK_KEY_TYPE keyType = CKK_RSA;
	CK_CERTIFICATE_TYPE certType = CKC_X_509;
	CK_BBOOL isOnToken = CK_FALSE;
	CK_BBOOL isPrivate = CK_TRUE;
	bool isImplicit = false;
	CK_RV rv = extractObjectInformation(pTemplate,ulCount,objClass,keyType,certType, isOnToken, isPrivate, isImplicit);
	if (rv != CKR_OK)
	{
		ERROR_MSG("Mandatory attribute not present in template");
		return rv;
	}

	// Check user credentials
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Change order of attributes
	const CK_ULONG maxAttribs = 32;
	CK_ATTRIBUTE attribs[maxAttribs];
	CK_ATTRIBUTE saveAttribs[maxAttribs];
	CK_ULONG attribsCount = 0;
	CK_ULONG saveAttribsCount = 0;
	if (ulCount > maxAttribs)
	{
		return CKR_TEMPLATE_INCONSISTENT;
	}
	for (CK_ULONG i=0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CHECK_VALUE:
				saveAttribs[saveAttribsCount++] = pTemplate[i];
				break;
			default:
				attribs[attribsCount++] = pTemplate[i];
		}
	}
	for (CK_ULONG i=0; i < saveAttribsCount; i++)
	{
		attribs[attribsCount++] = saveAttribs[i];
	}

	P11Object* p11object = NULL;
	rv = newP11Object(objClass,keyType,certType,&p11object);
	if (rv != CKR_OK)
		return rv;

	// Create the object in session or on the token
	OSObject *object = NULL_PTR;
	if (isOnToken)
	{
		object = (OSObject*) token->createObject();
	}
	else
	{
		object = sessionObjectStore->createObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE);
	}

	if (object == NULL || !p11object->init(object))
	{
		delete p11object;
		return CKR_GENERAL_ERROR;
	}

	rv = p11object->saveTemplate(token, isPrivate != CK_FALSE, attribs,attribsCount,op);
	delete p11object;
	if (rv != CKR_OK)
		return rv;

	if (op == OBJECT_OP_CREATE)
	{
		if (objClass == CKO_PUBLIC_KEY &&
		    (!object->startTransaction() ||
		    !object->setAttribute(CKA_LOCAL, false) ||
		    !object->commitTransaction()))
		{
			return CKR_GENERAL_ERROR;
		}

		if ((objClass == CKO_SECRET_KEY || objClass == CKO_PRIVATE_KEY) &&
		    (!object->startTransaction() ||
		    !object->setAttribute(CKA_LOCAL, false) ||
		    !object->setAttribute(CKA_ALWAYS_SENSITIVE, false) ||
		    !object->setAttribute(CKA_NEVER_EXTRACTABLE, false) ||
		    !object->commitTransaction()))
		{
			return CKR_GENERAL_ERROR;
		}
	}

	if (isOnToken)
	{
		*phObject = handleManager->addTokenObject(slot->getSlotID(), isPrivate != CK_FALSE, object);
	} else {
		*phObject = handleManager->addSessionObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE, object);
	}

	return CKR_OK;
}